

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::operator-=(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,work_t s)

{
  store_t sVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  uchar v;
  long i;
  long k;
  int d;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this;
  int iVar5;
  uint in_stack_ffffffffffffffdc;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar6;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_18;
  int local_10;
  
  local_10 = 0;
  while (iVar5 = local_10,
        iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDI),
        iVar5 < iVar3) {
    local_18 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0;
    while (this = local_18,
          lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI),
          (long)this < lVar4) {
      pIVar6 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0;
      while (this_00 = pIVar6,
            lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI),
            (long)pIVar6 < lVar4) {
        in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
        sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                          (in_RDI,(long)this_00,(long)local_18,local_10);
        in_stack_ffffffffffffffdc = CONCAT13(sVar1,(int3)in_stack_ffffffffffffffdc);
        bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidS
                          (this,(store_t)((ulong)pIVar6 >> 0x38));
        if (bVar2) {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setLimited
                    (this_00,CONCAT44(in_stack_ffffffffffffffdc,iVar5),(long)this,
                     (int)((ulong)pIVar6 >> 0x20),(work_t)pIVar6);
        }
        pIVar6 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 ((long)&this_00->depth + 1);
      }
      local_18 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 ((long)&local_18->depth + 1);
    }
    local_10 = local_10 + 1;
  }
  return in_RDI;
}

Assistant:

Image<T> &operator-=(Image<T> &image, typename Image<T>::work_t s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, v-s);
        }
      }
    }
  }

  return image;
}